

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O0

diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
 __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
::
visit_node<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
          (traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
           *this,index_pointer node,uint shifts,
          diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          out)

{
  bool bVar1;
  address addr;
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  *this_00;
  uint shifts_local;
  traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  *this_local;
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  out_local;
  index_pointer node_local;
  
  this_local = (traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)out.p_.ptr_;
  out_local.p_.ptr_ =
       (not_null<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>::params_*>
        )(not_null<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>::params_*>
          )node;
  bVar1 = pstore::index::details::index_pointer::is_leaf((index_pointer *)&out_local);
  if (bVar1) {
    bVar1 = pstore::index::details::index_pointer::is_address((index_pointer *)&out_local);
    if (!bVar1) {
      assert_failed("node.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                    ,0x62);
    }
    bVar1 = traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
            ::is_new((traverser<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                      *)this,(index_pointer)out_local.p_.ptr_);
    if (bVar1) {
      addr = pstore::index::details::index_pointer::to_address((index_pointer *)&out_local);
      this_00 = diff_dump::details::
                diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                ::operator*((diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                             *)&this_local);
      diff_dump::details::
      diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::operator=(this_00,addr);
      diff_dump::details::
      diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::operator++((diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                    *)&this_local);
    }
    node_local.internal_ = (internal_node *)this_local;
  }
  else {
    bVar1 = pstore::index::details::depth_is_internal_node(shifts);
    if (bVar1) {
      node_local.addr_.a_ =
           (address)visit_intermediate<pstore::index::details::internal_node,pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                              (this,(index_pointer)out_local.p_.ptr_,shifts,
                               (diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                                )this_local);
    }
    else {
      node_local.addr_.a_ =
           (address)visit_intermediate<pstore::index::details::linear_node,pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                              (this,(index_pointer)out_local.p_.ptr_,shifts,
                               (diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                                )this_local);
    }
  }
  return (diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          )node_local.internal_;
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }